

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

int __thiscall StringBTree::lessThanKeyCompareOp(StringBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  byte *data_00;
  ulong uVar6;
  
  uVar6 = (ulong)*data;
  data_00 = data + 1;
  if ((char)*data < '\0') {
    uVar5 = 0x80;
    do {
      bVar1 = *data_00;
      lVar3 = uVar6 - uVar5;
      data_00 = data_00 + 1;
      uVar5 = uVar5 << 7;
      uVar4 = lVar3 * 0x100;
      uVar6 = bVar1 | uVar4;
    } while ((uVar4 & uVar5) != 0);
  }
  iVar2 = equalKeyCompareOp(this,key,data_00);
  return iVar2 + (uint)(iVar2 == 0);
}

Assistant:

int lessThanKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		// TODO: figure out
		const auto unk = static_cast<uint32_t>(decodeBitsAndAdvance(data));

		const auto result = equalKeyCompareOp(key, data);
		
		return (result != 0) ? result : 1;
	}